

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InversionStamp.cpp
# Opt level: O0

void __thiscall OpenMD::InversionStamp::InversionStamp(InversionStamp *this)

{
  DataHolder *in_RDI;
  
  DataHolder::DataHolder(in_RDI);
  in_RDI->_vptr_DataHolder = (_func_int **)&PTR__InversionStamp_0037e1e8;
  Parameter<int>::Parameter((Parameter<int> *)in_RDI);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x2ad343);
  *(undefined1 *)&in_RDI[1].deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = 0;
  std::__cxx11::string::string
            ((string *)
             &in_RDI[1].deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x2ad36c);
  return;
}

Assistant:

InversionStamp::InversionStamp() : hasOverride_(false) {}